

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void tetrahedralize(tetgenbehavior *b,tetgenio *in,tetgenio *out,tetgenio *addin,tetgenio *bgmin)

{
  long lVar1;
  int iVar2;
  tetgenmesh *this;
  clock_t cVar3;
  clock_t cVar4;
  char *pcVar5;
  double dVar6;
  long local_668;
  clock_t local_660;
  clock_t local_658;
  clock_t local_650;
  clock_t local_638;
  tetgenmesh m;
  
  tetgenmesh::tetgenmesh(&m);
  local_638 = clock();
  m.in = in;
  m.addin = addin;
  m.b = b;
  if (((bgmin != (tetgenio *)0x0) && (b->metric != 0)) && (0 < bgmin->numberofpoints)) {
    this = (tetgenmesh *)operator_new(0x600);
    tetgenmesh::tetgenmesh(this);
    this->b = b;
    this->in = bgmin;
    m.bgm = this;
  }
  tetgenmesh::initializepools(&m);
  tetgenmesh::transfernodes(&m);
  exactinit(b->verbose,b->noexact,b->nostaticfilter,m.xmax - m.xmin,m.ymax - m.ymin,m.zmax - m.zmin)
  ;
  cVar3 = clock();
  if (b->refine == 0) {
    tetgenmesh::incrementaldelaunay(&m,&local_668);
  }
  else {
    tetgenmesh::reconstructmesh(&m);
  }
  cVar4 = clock();
  if (b->quiet == 0) {
    dVar6 = (double)(cVar4 - cVar3) / 1000000.0;
    if (b->refine == 0) {
      printf("Delaunay seconds:  %g\n",dVar6);
      if (b->verbose == 0) goto LAB_0014e6fc;
      dVar6 = (double)(local_668 - cVar3) / 1000000.0;
      pcVar5 = "  Point sorting seconds:  %g\n";
    }
    else {
      pcVar5 = "Mesh reconstruction seconds:  %g\n";
    }
    printf(pcVar5,dVar6);
  }
LAB_0014e6fc:
  if ((b->plc != 0) && (b->refine == 0)) {
    tetgenmesh::meshsurface(&m);
    cVar3 = clock();
    local_668 = cVar3;
    if (b->quiet == 0) {
      printf("Surface mesh seconds:  %g\n",(double)(cVar3 - cVar4) / 1000000.0);
    }
    if (b->diagnose != 0) {
      tetgenmesh::detectinterfaces(&m);
      cVar4 = clock();
      if (b->quiet == 0) {
        printf("Self-intersection seconds:  %g\n",(double)(cVar4 - cVar3) / 1000000.0);
      }
      if (0 < (m.subfaces)->items) {
        tetgenmesh::outnodes(&m,out);
        tetgenmesh::outsubfaces(&m,out);
      }
      goto LAB_0014eef1;
    }
  }
  cVar3 = clock();
  if (m.bgm != (tetgenmesh *)0x0 && b->metric != 0) {
    tetgenmesh::initializepools(m.bgm);
    tetgenmesh::transfernodes(m.bgm);
    tetgenmesh::reconstructmesh(m.bgm);
    cVar4 = clock();
    local_668 = cVar4;
    if (b->quiet == 0) {
      printf("Background mesh reconstruct seconds:  %g\n",(double)(cVar4 - cVar3) / 1000000.0);
    }
    if (b->metric != 0) {
      tetgenmesh::interpolatemeshsize(&m);
      local_660 = clock();
      if (b->quiet == 0) {
        printf("Size interpolating seconds:  %g\n",(double)(local_660 - cVar4) / 1000000.0);
      }
    }
  }
  cVar3 = clock();
  if ((b->plc != 0) && (b->refine == 0)) {
    if (b->nobisect == 0) {
      tetgenmesh::constraineddelaunay(&m,&local_668);
    }
    else {
      tetgenmesh::recoverboundary(&m,&local_668);
    }
    cVar4 = clock();
    local_660 = cVar4;
    if (b->quiet == 0) {
      pcVar5 = "Boundary recovery ";
      if (b->nobisect == 0) {
        pcVar5 = "Constrained Delaunay ";
      }
      printf(pcVar5);
      printf("seconds:  %g\n",(double)(cVar4 - cVar3) / 1000000.0);
      lVar1 = local_668;
      if (b->verbose != 0) {
        printf("  Segment recovery seconds:  %g\n",(double)(local_668 - cVar3) / 1000000.0);
        printf("  Facet recovery seconds:  %g\n",(double)(cVar4 - lVar1) / 1000000.0);
      }
    }
    tetgenmesh::carveholes(&m);
    cVar3 = clock();
    local_658 = cVar3;
    if (b->quiet == 0) {
      printf("Exterior tets removal seconds:  %g\n",(double)(cVar3 - cVar4) / 1000000.0);
    }
    if ((b->nobisect != 0) && (0 < (m.subvertstack)->objects)) {
      tetgenmesh::suppresssteinerpoints(&m);
      local_650 = clock();
      if (b->quiet == 0) {
        printf("Steiner suppression seconds:  %g\n",(double)(local_650 - cVar3) / 1000000.0);
      }
    }
  }
  cVar3 = clock();
  if (b->coarsen != 0) {
    tetgenmesh::meshcoarsening(&m);
  }
  cVar4 = clock();
  if ((b->quiet == 0) && (b->coarsen != 0)) {
    printf("Mesh coarsening seconds:  %g\n",(double)(cVar4 - cVar3) / 1000000.0);
  }
  if (((b->plc != 0) && (b->nobisect != 0)) || (b->coarsen != 0)) {
    tetgenmesh::recoverdelaunay(&m);
  }
  cVar3 = clock();
  iVar2 = b->plc;
  if ((b->quiet == 0) && (((iVar2 != 0 && (b->nobisect != 0)) || (b->coarsen != 0)))) {
    printf("Delaunay recovery seconds:  %g\n",(double)(cVar3 - cVar4) / 1000000.0);
    iVar2 = b->plc;
  }
  if (((iVar2 != 0) || (b->refine != 0)) &&
     ((addin != (tetgenio *)0x0 && ((b->insertaddpoints != 0 && (0 < addin->numberofpoints)))))) {
    tetgenmesh::insertconstrainedpoints(&m,addin);
  }
  cVar4 = clock();
  if ((b->quiet == 0) &&
     ((((b->plc != 0 || (b->refine != 0)) && (addin != (tetgenio *)0x0)) &&
      ((b->insertaddpoints != 0 && (0 < addin->numberofpoints)))))) {
    printf("Constrained points seconds:  %g\n",(double)(cVar4 - cVar3) / 1000000.0);
  }
  if (b->quality != 0) {
    tetgenmesh::delaunayrefinement(&m);
  }
  cVar3 = clock();
  if ((b->quiet == 0) && (b->quality != 0)) {
    printf("Refinement seconds:  %g\n",(double)(cVar3 - cVar4) / 1000000.0);
  }
  if (((b->plc != 0) || (b->refine != 0)) && (0 < b->optlevel)) {
    tetgenmesh::optimizemesh(&m);
  }
  cVar4 = clock();
  if (((b->quiet == 0) && ((b->plc != 0 || (b->refine != 0)))) && (0 < b->optlevel)) {
    printf("Optimization seconds:  %g\n",(double)(cVar4 - cVar3) / 1000000.0);
  }
  if ((b->nojettison == 0) &&
     (((0 < m.dupverts || (0 < m.unuverts)) || ((b->refine != 0 && (in->numberofcorners == 10))))))
  {
    tetgenmesh::jettisonnodes(&m);
  }
  if ((b->order == 2) && (b->convex == 0)) {
    tetgenmesh::highorder(&m);
  }
  if (b->quiet == 0) {
    putchar(10);
  }
  if (out != (tetgenio *)0x0) {
    iVar2 = in->mesh_dim;
    out->firstnumber = in->firstnumber;
    out->mesh_dim = iVar2;
  }
  if ((b->nonodewritten == 0) && (b->noiterationnum == 0)) {
    tetgenmesh::outnodes(&m,out);
  }
  else if (b->quiet == 0) {
    puts("NOT writing a .node file.");
  }
  if (b->noelewritten == 0) {
    if (0 < (m.tetrahedrons)->items) {
      tetgenmesh::outelements(&m,out);
    }
  }
  else {
    if (b->quiet == 0) {
      puts("NOT writing an .ele file.");
    }
    tetgenmesh::indexelements(&m);
  }
  if (b->nofacewritten == 0) {
    if (b->facesout == 0) {
      if ((b->plc == 0) && (b->refine == 0)) {
        if (0 < (m.tetrahedrons)->items) {
          tetgenmesh::outhullfaces(&m,out);
        }
      }
      else if (0 < (m.subfaces)->items) {
        tetgenmesh::outsubfaces(&m,out);
      }
    }
    else if (0 < (m.tetrahedrons)->items) {
      tetgenmesh::outfaces(&m,out);
    }
LAB_0014ebf6:
    if (b->nofacewritten != 0) {
      if (b->quiet == 0) {
        puts("NOT writing an .edge file.");
      }
      goto LAB_0014edaa;
    }
    if (b->edgesout != 0) {
      tetgenmesh::outedges(&m,out);
      goto LAB_0014edaa;
    }
    if ((b->plc != 0) || (b->refine != 0)) {
      tetgenmesh::outsubsegments(&m,out);
      goto LAB_0014edaa;
    }
  }
  else {
    if (b->quiet == 0) {
      puts("NOT writing an .face file.");
      goto LAB_0014ebf6;
    }
LAB_0014edaa:
    if (((b->plc != 0) || (b->refine != 0)) && (b->metric != 0)) {
      tetgenmesh::outmetrics(&m,out);
    }
  }
  if (out == (tetgenio *)0x0) {
    if ((b->plc != 0) && (b->object - OFF < 3)) {
      tetgenmesh::outsmesh(&m,b->outfilename);
    }
    if (b->meditview != 0) {
      tetgenmesh::outmesh2medit(&m,b->outfilename);
    }
    if (b->vtkview != 0) {
      tetgenmesh::outmesh2vtk(&m,b->outfilename);
    }
  }
  if (b->neighout != 0) {
    tetgenmesh::outneighbors(&m,out);
  }
  if (b->voroout != 0) {
    tetgenmesh::outvoronoi(&m,out);
  }
  cVar3 = clock();
  if (b->quiet == 0) {
    printf("\nOutput seconds:  %g\n",(double)(cVar3 - cVar4) / 1000000.0);
    printf("Total running seconds:  %g\n",(double)(cVar3 - local_638) / 1000000.0);
  }
  if (b->docheck != 0) {
    tetgenmesh::checkmesh(&m,0);
    if ((b->plc != 0) || (b->refine != 0)) {
      tetgenmesh::checkshells(&m);
      tetgenmesh::checksegments(&m);
    }
    if (1 < b->docheck) {
      tetgenmesh::checkdelaunay(&m,1);
    }
  }
  if (b->quiet == 0) {
    tetgenmesh::statistics(&m);
  }
LAB_0014eef1:
  tetgenmesh::freememory(&m);
  return;
}

Assistant:

void tetrahedralize(tetgenbehavior *b, tetgenio *in, tetgenio *out,
                    tetgenio *addin, tetgenio *bgmin)
{
  tetgenmesh m;
  clock_t tv[12], ts[5]; // Timing informations (defined in time.h)
  REAL cps = (REAL) CLOCKS_PER_SEC;

  tv[0] = clock();
 
  m.b = b;
  m.in = in;
  m.addin = addin;

  if (b->metric && bgmin && (bgmin->numberofpoints > 0)) {
    m.bgm = new tetgenmesh(); // Create an empty background mesh.
    m.bgm->b = b;
    m.bgm->in = bgmin;
  }

  m.initializepools();
  m.transfernodes();

  exactinit(b->verbose, b->noexact, b->nostaticfilter,
            m.xmax - m.xmin, m.ymax - m.ymin, m.zmax - m.zmin);

  tv[1] = clock();

  if (b->refine) { // -r
    m.reconstructmesh();
  } else { // -p
    m.incrementaldelaunay(ts[0]);
  }

  tv[2] = clock();

  if (!b->quiet) {
    if (b->refine) {
      printf("Mesh reconstruction seconds:  %g\n", ((REAL)(tv[2]-tv[1])) / cps);
    } else {
      printf("Delaunay seconds:  %g\n", ((REAL)(tv[2]-tv[1])) / cps);
      if (b->verbose) {
        printf("  Point sorting seconds:  %g\n", ((REAL)(ts[0]-tv[1])) / cps);
      }
    }
  }

  if (b->plc && !b->refine) { // -p
    m.meshsurface();

    ts[0] = clock();

    if (!b->quiet) {
      printf("Surface mesh seconds:  %g\n", ((REAL)(ts[0]-tv[2])) / cps);
    }

    if (b->diagnose) { // -d
      m.detectinterfaces();

      ts[1] = clock();

      if (!b->quiet) {
        printf("Self-intersection seconds:  %g\n", ((REAL)(ts[1]-ts[0])) / cps);
      }

      // Only output when self-intersecting faces exist.
      if (m.subfaces->items > 0l) {
        m.outnodes(out);
        m.outsubfaces(out);
      }

      return;
    }
  }

  tv[3] = clock();

  if ((b->metric) && (m.bgm != NULL)) { // -m
    m.bgm->initializepools();
    m.bgm->transfernodes();
    m.bgm->reconstructmesh();

    ts[0] = clock();

    if (!b->quiet) {
      printf("Background mesh reconstruct seconds:  %g\n",
             ((REAL)(ts[0] - tv[3])) / cps);
    }

    if (b->metric) { // -m
      m.interpolatemeshsize();

      ts[1] = clock();

      if (!b->quiet) {
        printf("Size interpolating seconds:  %g\n",((REAL)(ts[1]-ts[0])) / cps);
      }
    }
  }

  tv[4] = clock();

  if (b->plc && !b->refine) { // -p
    if (b->nobisect) { // -Y
      m.recoverboundary(ts[0]);
    } else {
      m.constraineddelaunay(ts[0]);
    }

    ts[1] = clock();

    if (!b->quiet) {
      if (b->nobisect) {
        printf("Boundary recovery ");
      } else {
        printf("Constrained Delaunay ");
      }
      printf("seconds:  %g\n", ((REAL)(ts[1] - tv[4])) / cps);
      if (b->verbose) {
        printf("  Segment recovery seconds:  %g\n",((REAL)(ts[0]-tv[4]))/ cps);
        printf("  Facet recovery seconds:  %g\n", ((REAL)(ts[1]-ts[0])) / cps);
      }
    }

    m.carveholes();

    ts[2] = clock();

    if (!b->quiet) {
      printf("Exterior tets removal seconds:  %g\n",((REAL)(ts[2]-ts[1]))/cps);
    }

    if (b->nobisect) { // -Y
      if (m.subvertstack->objects > 0l) {
        m.suppresssteinerpoints();

        ts[3] = clock();

        if (!b->quiet) {
          printf("Steiner suppression seconds:  %g\n",
                 ((REAL)(ts[3]-ts[2]))/cps);
        }
      }
    }
  }

  tv[5] = clock();

  if (b->coarsen) { // -R
    m.meshcoarsening();
  }

  tv[6] = clock();

  if (!b->quiet) {
    if (b->coarsen) {
      printf("Mesh coarsening seconds:  %g\n", ((REAL)(tv[6] - tv[5])) / cps);
    }
  }

  if ((b->plc && b->nobisect) || b->coarsen) {
    m.recoverdelaunay();
  }

  tv[7] = clock();

  if (!b->quiet) {
    if ((b->plc && b->nobisect) || b->coarsen) {
      printf("Delaunay recovery seconds:  %g\n", ((REAL)(tv[7] - tv[6]))/cps);
    }
  }

  if ((b->plc || b->refine) && b->insertaddpoints) { // -i
    if ((addin != NULL) && (addin->numberofpoints > 0)) {
      m.insertconstrainedpoints(addin); 
    }
  }

  tv[8] = clock();

  if (!b->quiet) {
    if ((b->plc || b->refine) && b->insertaddpoints) { // -i
      if ((addin != NULL) && (addin->numberofpoints > 0)) {
        printf("Constrained points seconds:  %g\n", ((REAL)(tv[8]-tv[7]))/cps);
      }
    }
  }

  if (b->quality) {
    m.delaunayrefinement();    
  }

  tv[9] = clock();

  if (!b->quiet) {
    if (b->quality) {
      printf("Refinement seconds:  %g\n", ((REAL)(tv[9] - tv[8])) / cps);
    }
  }

  if ((b->plc || b->refine) && (b->optlevel > 0)) {
    m.optimizemesh();
  }

  tv[10] = clock();

  if (!b->quiet) {
    if ((b->plc || b->refine) && (b->optlevel > 0)) {
      printf("Optimization seconds:  %g\n", ((REAL)(tv[10] - tv[9])) / cps);
    }
  }

  if (!b->nojettison && ((m.dupverts > 0) || (m.unuverts > 0)
      || (b->refine && (in->numberofcorners == 10)))) {
    m.jettisonnodes();
  }

  if ((b->order == 2) && !b->convex) {
    m.highorder();
  }

  if (!b->quiet) {
    printf("\n");
  }

  if (out != (tetgenio *) NULL) {
    out->firstnumber = in->firstnumber;
    out->mesh_dim = in->mesh_dim;
  }

  if (b->nonodewritten || b->noiterationnum) {
    if (!b->quiet) {
      printf("NOT writing a .node file.\n");
    }
  } else {
    m.outnodes(out);
  }

  if (b->noelewritten) {
    if (!b->quiet) {
      printf("NOT writing an .ele file.\n");
    }
    m.indexelements();
  } else {
    if (m.tetrahedrons->items > 0l) {
      m.outelements(out);
    }
  }

  if (b->nofacewritten) {
    if (!b->quiet) {
      printf("NOT writing an .face file.\n");
    }
  } else {
    if (b->facesout) {
      if (m.tetrahedrons->items > 0l) {
        m.outfaces(out);  // Output all faces.
      }
    } else {
      if (b->plc || b->refine) {
        if (m.subfaces->items > 0l) {
          m.outsubfaces(out); // Output boundary faces.
        }
      } else {
        if (m.tetrahedrons->items > 0l) {
          m.outhullfaces(out); // Output convex hull faces.
        }
      }
    }
  }


  if (b->nofacewritten) {
    if (!b->quiet) {
      printf("NOT writing an .edge file.\n");
    }
  } else {
    if (b->edgesout) { // -e
      m.outedges(out); // output all mesh edges. 
    } else {
      if (b->plc || b->refine) {
        m.outsubsegments(out); // output subsegments.
      }
    }
  }

  if ((b->plc || b->refine) && b->metric) { // -m
    m.outmetrics(out);
  }

  if (!out && b->plc && 
      ((b->object == tetgenbehavior::OFF) ||
       (b->object == tetgenbehavior::PLY) ||
       (b->object == tetgenbehavior::STL))) {
    m.outsmesh(b->outfilename);
  }

  if (!out && b->meditview) {
    m.outmesh2medit(b->outfilename); 
  }


  if (!out && b->vtkview) {
    m.outmesh2vtk(b->outfilename); 
  }

  if (b->neighout) {
    m.outneighbors(out);
  }

  if (b->voroout) {
    m.outvoronoi(out);
  }


  tv[11] = clock();

  if (!b->quiet) {
    printf("\nOutput seconds:  %g\n", ((REAL)(tv[11] - tv[10])) / cps);
    printf("Total running seconds:  %g\n", ((REAL)(tv[11] - tv[0])) / cps);
  }

  if (b->docheck) {
    m.checkmesh(0);
    if (b->plc || b->refine) {
      m.checkshells();
      m.checksegments();
    }
    if (b->docheck > 1) {
      m.checkdelaunay();
    }
  }

  if (!b->quiet) {
    m.statistics();
  }
}